

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveColumnWriter::BeginWrite(PrimitiveColumnWriter *this,ColumnWriterState *state_p)

{
  int iVar1;
  undefined4 uVar2;
  size_type sVar3;
  reference pvVar4;
  unsigned_long a;
  long *in_RDI;
  PageHeader *hdr;
  PageWriteInformation write_info;
  value_type *page_info;
  idx_t page_idx;
  PrimitiveColumnWriterState *state;
  value_type *in_stack_fffffffffffffd28;
  PageWriteInformation *in_stack_fffffffffffffd30;
  PageWriteInformation *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined1 local_280 [8];
  unsigned_long in_stack_fffffffffffffd88;
  vector<duckdb::PageInformation,_true> *in_stack_fffffffffffffd90;
  PrimitiveColumnWriterState *in_stack_fffffffffffffda8;
  PrimitiveColumnWriter *in_stack_fffffffffffffdb0;
  ulong local_28;
  undefined1 local_20 [8];
  PrimitiveColumnWriterState *local_18;
  
  local_18 = ColumnWriterState::Cast<duckdb::PrimitiveColumnWriterState>
                       ((ColumnWriterState *)in_stack_fffffffffffffd30);
  (**(code **)(*in_RDI + 0x58))(local_20);
  unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>,_true>
  ::operator=((unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>,_true>
               *)in_stack_fffffffffffffd30,
              (unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>,_true>
               *)in_stack_fffffffffffffd28);
  unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>,_true>
                 *)0x86c335);
  local_28 = 0;
  do {
    sVar3 = std::vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>::size
                      (&(local_18->page_info).
                        super_vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>
                      );
    if (sVar3 <= local_28) {
LAB_0086c613:
      NextPage(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      return;
    }
    pvVar4 = vector<duckdb::PageInformation,_true>::operator[]
                       ((vector<duckdb::PageInformation,_true> *)in_stack_fffffffffffffd30,
                        (size_type)in_stack_fffffffffffffd28);
    if (pvVar4->row_count == 0) {
      vector<duckdb::PageInformation,_true>::erase_at
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      goto LAB_0086c613;
    }
    in_stack_fffffffffffffda8 = (PrimitiveColumnWriterState *)&stack0xfffffffffffffdb0;
    PageWriteInformation::PageWriteInformation(in_stack_fffffffffffffd50);
    iVar1 = UnsafeNumericCast<int,unsigned_long,void>(pvVar4->row_count);
    *(int *)&(in_stack_fffffffffffffda8->super_ColumnWriterState).repetition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start = iVar1;
    uVar2 = (**(code **)(*in_RDI + 0x50))(in_RDI,local_18);
    *(undefined4 *)
     ((long)&(in_stack_fffffffffffffda8->super_ColumnWriterState).repetition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = uVar2;
    *(undefined4 *)
     &(in_stack_fffffffffffffda8->super_ColumnWriterState).repetition_levels.
      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = 3;
    *(undefined4 *)
     ((long)&(in_stack_fffffffffffffda8->super_ColumnWriterState).repetition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 3;
    in_stack_fffffffffffffd50 =
         (PageWriteInformation *)ParquetWriter::GetContext((ParquetWriter *)in_RDI[1]);
    duckdb::Allocator::Get((ClientContext *)in_stack_fffffffffffffd50);
    a = duckdb::NextPowerOfTwo(pvVar4->estimated_page_size);
    in_stack_fffffffffffffd88 = MaxValue<unsigned_long>(a,0x200);
    make_uniq<duckdb::MemoryStream,duckdb::Allocator&,unsigned_long>
              ((Allocator *)CONCAT44(uVar2,in_stack_fffffffffffffd58),
               (unsigned_long *)in_stack_fffffffffffffd50);
    in_stack_fffffffffffffd30 = (PageWriteInformation *)&stack0xfffffffffffffd90;
    unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::operator=
              ((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
               in_stack_fffffffffffffd30,
               (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
               in_stack_fffffffffffffd28);
    unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::~unique_ptr
              ((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
               0x86c52e);
    (**(code **)(*in_RDI + 0x60))(local_280,in_RDI,local_18,local_28);
    in_stack_fffffffffffffd28 = (value_type *)local_280;
    unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
    ::operator=((unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
                 *)in_stack_fffffffffffffd30,
                (unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
                 *)in_stack_fffffffffffffd28);
    unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
    ::~unique_ptr((unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
                   *)0x86c59a);
    std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>::
    push_back((vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_> *
              )in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    PageWriteInformation::~PageWriteInformation(in_stack_fffffffffffffd30);
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void PrimitiveColumnWriter::BeginWrite(ColumnWriterState &state_p) {
	auto &state = state_p.Cast<PrimitiveColumnWriterState>();

	// set up the page write info
	state.stats_state = InitializeStatsState();
	for (idx_t page_idx = 0; page_idx < state.page_info.size(); page_idx++) {
		auto &page_info = state.page_info[page_idx];
		if (page_info.row_count == 0) {
			D_ASSERT(page_idx + 1 == state.page_info.size());
			state.page_info.erase_at(page_idx);
			break;
		}
		PageWriteInformation write_info;
		// set up the header
		auto &hdr = write_info.page_header;
		hdr.compressed_page_size = 0;
		hdr.uncompressed_page_size = 0;
		hdr.type = PageType::DATA_PAGE;
		hdr.__isset.data_page_header = true;

		hdr.data_page_header.num_values = UnsafeNumericCast<int32_t>(page_info.row_count);
		hdr.data_page_header.encoding = GetEncoding(state);
		hdr.data_page_header.definition_level_encoding = Encoding::RLE;
		hdr.data_page_header.repetition_level_encoding = Encoding::RLE;

		write_info.temp_writer = make_uniq<MemoryStream>(
		    Allocator::Get(writer.GetContext()),
		    MaxValue<idx_t>(NextPowerOfTwo(page_info.estimated_page_size), MemoryStream::DEFAULT_INITIAL_CAPACITY));
		write_info.write_count = page_info.empty_count;
		write_info.max_write_count = page_info.row_count;
		write_info.page_state = InitializePageState(state, page_idx);

		write_info.compressed_size = 0;
		write_info.compressed_data = nullptr;

		state.write_info.push_back(std::move(write_info));
	}

	// start writing the first page
	NextPage(state);
}